

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall Token::removeBrace(Token *this,char open,char close)

{
  long lVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000031;
  int iVar6;
  
  uVar4 = std::__cxx11::string::find((char)this,CONCAT71(in_register_00000031,open));
  if (uVar4 != 0xffffffffffffffff) {
    do {
      uVar3 = (this->content)._M_string_length;
      if (uVar3 <= uVar4 + 1) {
        return;
      }
      iVar6 = 1;
      lVar5 = 1;
      do {
        cVar2 = (this->content)._M_dataplus._M_p[lVar5 + uVar4];
        iVar6 = (iVar6 + (uint)(cVar2 == open)) - (uint)(cVar2 == close);
        lVar1 = lVar5 + uVar4;
        lVar5 = lVar5 + 1;
        if (uVar3 <= lVar1 + 1U) break;
      } while (iVar6 != 0);
      if (iVar6 != 0) {
        return;
      }
      std::__cxx11::string::erase((ulong)this,uVar4);
      uVar4 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)open);
    } while (uVar4 != 0xffffffffffffffff);
  }
  return;
}

Assistant:

void removeBrace(char open, char close) {
        size_t start = content.find(open);
        while (start != std::string::npos) {
            const size_t end = braceEnd(content, start, open, close);
            if (end == std::string::npos) {
                return;
            }

            content.erase(start, end - start + 1);

            start = content.find(open);
        }
    }